

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

void sys_fakefromgui(void)

{
  char *pcVar1;
  char local_658 [8];
  char buf [1000];
  undefined1 local_268 [4];
  int i;
  t_atom zz [38];
  
  pcVar1 = getcwd(local_658,1000);
  if (pcVar1 == (char *)0x0) {
    strcpy(local_658,".");
  }
  local_268 = (undefined1  [4])0x2;
  zz[0]._0_8_ = gensym(local_658);
  zz[0].a_w.w_float = 1.4013e-45;
  zz[1].a_type = A_NULL;
  buf[0x3e4] = '\0';
  buf[0x3e5] = '\0';
  buf[0x3e6] = '\0';
  buf[999] = '\0';
  for (; (int)buf._996_4_ < 0x24; buf._996_4_ = buf._996_4_ + 1) {
    zz[(long)(int)buf._996_4_ + 1].a_w.w_float = 1.4013e-45;
    zz[(long)(int)buf._996_4_ + 2].a_type = (t_atomtype)(float)defaultfontshit[(int)buf._996_4_];
  }
  glob_initfromgui((void *)0x0,(t_symbol *)0x0,0x26,(t_atom *)local_268);
  clock_free(sys_fakefromguiclk);
  return;
}

Assistant:

static void sys_fakefromgui(void)
{
        /* fake the GUI's message giving cwd and font sizes in case
        we aren't starting the gui. */
    t_atom zz[NDEFAULTFONT+2];
    int i;
    char buf[MAXPDSTRING];
#ifdef _WIN32
    if (GetCurrentDirectory(MAXPDSTRING, buf) == 0)
        strcpy(buf, ".");
#else
    if (!getcwd(buf, MAXPDSTRING))
        strcpy(buf, ".");
#endif
    SETSYMBOL(zz, gensym(buf));
    SETFLOAT(zz+1, 0);
    for (i = 0; i < (int)NDEFAULTFONT; i++)
        SETFLOAT(zz+i+2, defaultfontshit[i]);
    glob_initfromgui(0, 0, 2+NDEFAULTFONT, zz);
    clock_free(sys_fakefromguiclk);
}